

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int __thiscall
CVmObjFile::getp_digestMD5(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  int32_t iVar4;
  vm_obj_id_t vVar5;
  unsigned_long len;
  uint uVar6;
  char hash [33];
  char acStack_58 [40];
  
  if (oargc == (uint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *oargc;
  }
  if (getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_digestMD5();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_digestMD5::desc);
  if (iVar3 == 0) {
    check_raw_read(this);
    if ((uVar6 == 0) || (sp_[-1].typ == VM_NIL)) {
      len = get_file_size(this);
    }
    else {
      if (sp_[-1].typ == VM_INT) {
        iVar4 = sp_[-1].val.intval;
      }
      else {
        iVar4 = vm_val_t::nonint_num_to_int(sp_ + -1);
      }
      len = (unsigned_long)iVar4;
    }
    pvVar2 = sp_;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    md5_datasrc(acStack_58,*(CVmDataSource **)((this->super_CVmObject).ext_ + 8),len);
    vVar5 = CVmObjString::create(0,acStack_58,0x20);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar5;
    sp_ = sp_ + -(long)(int)(uVar6 + 1);
    return 1;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_digestMD5(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check that the it's a valid file open with read access in "raw" mode */
    check_raw_read(vmg0_);

    /* retrieve the length value, if present; if not, use the file size */
    long len = (argc >= 1 && G_stk->get(0)->typ != VM_NIL
                ? G_stk->get(0)->num_to_int(vmg0_)
                : get_file_size(vmg0_));

    /* save 'self' for gc protection */
    G_stk->push_obj(vmg_ self);

    /* calculate the hash */
    char hash[33];
    md5_datasrc(hash, get_ext()->fp, len);

    /* return the hash value */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, hash, 32));

    /* discard our gc protection and our arguments */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}